

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O3

void __thiscall Assimp::SMDImporter::SetupProperties(SMDImporter *this,Importer *pImp)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = Importer::GetPropertyInteger(pImp,"IMPORT_SMD_KEYFRAME",-1);
  this->configFrameID = uVar1;
  if (uVar1 == 0xffffffff) {
    uVar1 = Importer::GetPropertyInteger(pImp,"IMPORT_GLOBAL_KEYFRAME",0);
    this->configFrameID = uVar1;
  }
  iVar2 = Importer::GetPropertyInteger(pImp,"IMPORT_SMD_LOAD_ANIMATION_LIST",1);
  this->bLoadAnimationList = iVar2 != 0;
  iVar2 = Importer::GetPropertyInteger(pImp,"IMPORT_NO_SKELETON_MESHES",0);
  this->noSkeletonMesh = iVar2 != 0;
  return;
}

Assistant:

void SMDImporter::SetupProperties(const Importer* pImp) {
    // The
    // AI_CONFIG_IMPORT_SMD_KEYFRAME option overrides the
    // AI_CONFIG_IMPORT_GLOBAL_KEYFRAME option.
    configFrameID = pImp->GetPropertyInteger(AI_CONFIG_IMPORT_SMD_KEYFRAME,-1);
    if(static_cast<unsigned int>(-1) == configFrameID)  {
        configFrameID = pImp->GetPropertyInteger(AI_CONFIG_IMPORT_GLOBAL_KEYFRAME,0);
    }

    bLoadAnimationList = pImp->GetPropertyBool(AI_CONFIG_IMPORT_SMD_LOAD_ANIMATION_LIST, true);
    noSkeletonMesh = pImp->GetPropertyBool(AI_CONFIG_IMPORT_NO_SKELETON_MESHES, false);
}